

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

char * __thiscall
fmt::BasicWriter<char>::write_unsigned_decimal<unsigned_long>
          (BasicWriter<char> *this,unsigned_long value,uint prefix_size)

{
  Buffer<char> *pBVar1;
  size_t sVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  char *pcVar7;
  byte bVar8;
  char *pcVar9;
  ulong uVar10;
  
  lVar6 = 0x3f;
  if ((value | 1) != 0) {
    for (; (value | 1) >> lVar6 == 0; lVar6 = lVar6 + -1) {
    }
  }
  uVar4 = ((uint)lVar6 ^ 0xffffffc0) * 0x4d1 + 0x13911 >> 0xc;
  iVar5 = uVar4 - (value < internal::BasicData<void>::POWERS_OF_10_64[uVar4]);
  pBVar1 = this->buffer_;
  sVar2 = pBVar1->size_;
  uVar10 = (iVar5 + prefix_size + 1) + sVar2;
  if (pBVar1->capacity_ < uVar10) {
    (**pBVar1->_vptr_Buffer)(pBVar1,uVar10);
  }
  pBVar1->size_ = uVar10;
  pcVar9 = this->buffer_->ptr_ + sVar2;
  pcVar7 = pcVar9 + (ulong)(iVar5 + 1) + (ulong)prefix_size;
  uVar10 = value;
  if (99 < value) {
    do {
      value = uVar10 / 100;
      *(undefined2 *)(pcVar7 + -2) =
           *(undefined2 *)
            (
            "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
            + (ulong)(uint)((int)uVar10 + (int)value * -100) * 2);
      pcVar7 = pcVar7 + -2;
      bVar3 = 9999 < uVar10;
      uVar10 = value;
    } while (bVar3);
  }
  if (value < 10) {
    bVar8 = (byte)value | 0x30;
    lVar6 = -1;
  }
  else {
    pcVar7[-1] = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                 [(value * 2 & 0xffffffff) + 1];
    bVar8 = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
            [value * 2 & 0x1fffffffe];
    lVar6 = -2;
  }
  pcVar7[lVar6] = bVar8;
  return pcVar9;
}

Assistant:

Char *write_unsigned_decimal(UInt value, unsigned prefix_size = 0) {
    unsigned num_digits = internal::count_digits(value);
    Char *ptr = get(grow_buffer(prefix_size + num_digits));
    internal::format_decimal(ptr + prefix_size, value, num_digits);
    return ptr;
  }